

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

int Bmc_ComputeCanonical(sat_solver *pSat,Vec_Int_t *vLits,Vec_Int_t *vTemp,int nBTLimit)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  if (0 < vLits->nSize) {
    uVar6 = 0;
    do {
      vTemp->nSize = 0;
      if (-1 < (int)uVar6) {
        uVar7 = 0;
        do {
          if ((long)vLits->nSize <= (long)uVar7) goto LAB_0050adb1;
          Vec_IntPush(vTemp,vLits->pArray[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar6 + 1 != uVar7);
      }
      iVar3 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,(long)nBTLimit,0,0,0)
      ;
      if (iVar3 != 1) {
        if (iVar3 == 0) {
          return 0;
        }
        if (((int)uVar6 < 0) || (vLits->nSize <= (int)uVar6)) {
LAB_0050adb1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar2 = vLits->pArray;
        uVar1 = piVar2[uVar6];
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10d,"int Abc_LitIsCompl(int)");
        }
        if ((uVar1 & 1) == 0) {
          return -1;
        }
        piVar2[uVar6] = uVar1 & 0x7ffffffe;
        if ((int)(uVar6 + 1) < vLits->nSize) {
          puVar4 = (uint *)(piVar2 + uVar6);
          uVar1 = uVar6;
          do {
            puVar4 = puVar4 + 1;
            if ((int)uVar1 < -1) goto LAB_0050adb1;
            if ((int)*puVar4 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x110,"int Abc_LitRegular(int)");
            }
            *puVar4 = *puVar4 | 1;
            iVar5 = uVar1 + 2;
            uVar1 = uVar1 + 1;
          } while (iVar5 < vLits->nSize);
        }
        uVar6 = uVar6 - 1;
      }
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < vLits->nSize);
    if (iVar3 == 1) {
      return 1;
    }
  }
  __assert_fail("status == l_True",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcClp.c"
                ,0x268,"int Bmc_ComputeCanonical(sat_solver *, Vec_Int_t *, Vec_Int_t *, int)");
}

Assistant:

int Bmc_ComputeCanonical( sat_solver * pSat, Vec_Int_t * vLits, Vec_Int_t * vTemp, int nBTLimit )
{
    int i, k, iLit, status = l_Undef;
    for ( i = 0; i < Vec_IntSize(vLits); i++ )
    {
        // copy the first i+1 literals
        Vec_IntClear( vTemp );
        Vec_IntForEachEntryStop( vLits, iLit, k, i+1 )
            Vec_IntPush( vTemp, iLit );
        // check if it satisfies the on-set
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return l_Undef;
        if ( status == l_True )
            continue;
        // if it is UNSAT, try the opposite literal
        iLit = Vec_IntEntry( vLits, i );
        // if literal is positive, there is no way to flip it
        if ( !Abc_LitIsCompl(iLit) )
            return l_False;
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(iLit) );
        Vec_IntForEachEntryStart( vLits, iLit, k, i+1 )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(Abc_LitRegular(iLit)) );
        // recheck
        i--;
    }
    assert( status == l_True );
    return status;
}